

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O0

qpTestResult
glu::TextureTestUtil::compareGenMipmapResult
          (TestLog *log,TextureCube *resultTexture,TextureCube *level0Reference,
          GenMipmapPrecision *precision)

{
  void *__s;
  CubeFace CVar1;
  bool bVar2;
  int iVar3;
  int height;
  char *imageSetName;
  char *imageSetDesc;
  ConstPixelBufferAccess *pCVar4;
  ConstPixelBufferAccess *result_00;
  MessageBuilder *pMVar5;
  TestLog *this;
  allocator<char> local_bb1;
  string local_bb0;
  allocator<char> local_b89;
  string local_b88;
  LogImage local_b68;
  allocator<char> local_ad1;
  string local_ad0;
  allocator<char> local_aa9;
  string local_aa8;
  LogImage local_a88;
  allocator<char> local_9f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9f0;
  string local_9d0;
  allocator<char> local_9a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_988;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_968;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_948;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_928;
  string local_908;
  string local_8e8;
  allocator<char> local_8c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_880;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_860;
  LogImageSet local_840;
  MessageBuilder local_800;
  PixelBufferAccess local_680;
  int local_654;
  undefined1 local_650 [4];
  int numFailed_2;
  PixelBufferAccess local_4d0;
  int local_4a4;
  undefined1 local_4a0 [4];
  int numFailed_1;
  PixelBufferAccess local_320;
  int local_2f8;
  byte local_2f1;
  int numFailed;
  bool levelOk;
  Surface errorMask;
  ConstPixelBufferAccess dst;
  ConstPixelBufferAccess src;
  char *faceName;
  CubeFace local_278;
  CubeFace face_1;
  int faceNdx_1;
  int levelNdx;
  allocator<char> local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_55;
  undefined1 local_54 [7];
  bool level0Ok;
  undefined1 local_44 [8];
  Vec4 threshold;
  CubeFace face;
  int faceNdx;
  qpTestResult result;
  GenMipmapPrecision *precision_local;
  TextureCube *level0Reference_local;
  TextureCube *resultTexture_local;
  TestLog *log_local;
  
  face = CUBEFACE_NEGATIVE_X;
  for (threshold.m_data[3] = 0.0; (int)threshold.m_data[3] < 6;
      threshold.m_data[3] = (float)((int)threshold.m_data[3] + 1)) {
    threshold.m_data[2] = threshold.m_data[3];
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_54,1.0);
    tcu::select<float,4>
              ((tcu *)local_44,&precision->colorThreshold,(Vector<float,_4> *)local_54,
               &precision->colorMask);
    de::toString<int>(&local_98,(int *)(threshold.m_data + 3));
    std::operator+(&local_78,"Level0Face",&local_98);
    imageSetName = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"Level 0, face ",&local_e9);
    std::operator+(&local_c8,&local_e8,
                   compareGenMipmapResult::s_faceNames[(uint)threshold.m_data[2]]);
    imageSetDesc = (char *)std::__cxx11::string::c_str();
    pCVar4 = tcu::TextureCube::getLevelFace(level0Reference,0,(CubeFace)threshold.m_data[2]);
    result_00 = tcu::TextureCube::getLevelFace(resultTexture,0,(CubeFace)threshold.m_data[2]);
    bVar2 = tcu::floatThresholdCompare
                      (log,imageSetName,imageSetDesc,pCVar4,result_00,(Vec4 *)local_44,
                       COMPARE_LOG_RESULT);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator(&local_e9);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    local_55 = bVar2;
    if (!bVar2) {
      tcu::TestLog::operator<<
                ((MessageBuilder *)&faceNdx_1,log,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)&faceNdx_1,(char (*) [22])"ERROR: Level 0, face ");
      pMVar5 = tcu::MessageBuilder::operator<<
                         (pMVar5,compareGenMipmapResult::s_faceNames + (uint)threshold.m_data[2]);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [20])0xf9a54d);
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&faceNdx_1);
      face = CUBEFACE_POSITIVE_X;
    }
  }
  for (face_1 = CUBEFACE_POSITIVE_X; CVar1 = face_1,
      iVar3 = tcu::TextureCube::getNumLevels(resultTexture), (int)CVar1 < iVar3;
      face_1 = face_1 + CUBEFACE_POSITIVE_X) {
    for (local_278 = CUBEFACE_NEGATIVE_X; CVar1 = local_278, (int)local_278 < 6;
        local_278 = local_278 + CUBEFACE_POSITIVE_X) {
      src.m_data = compareGenMipmapResult::s_faceNames[local_278];
      pCVar4 = tcu::TextureCube::getLevelFace(resultTexture,face_1 - CUBEFACE_POSITIVE_X,local_278);
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                ((ConstPixelBufferAccess *)&dst.m_data,pCVar4);
      pCVar4 = tcu::TextureCube::getLevelFace(resultTexture,face_1,CVar1);
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                ((ConstPixelBufferAccess *)&errorMask.m_pixels.m_cap,pCVar4);
      iVar3 = tcu::ConstPixelBufferAccess::getWidth
                        ((ConstPixelBufferAccess *)&errorMask.m_pixels.m_cap);
      height = tcu::ConstPixelBufferAccess::getHeight
                         ((ConstPixelBufferAccess *)&errorMask.m_pixels.m_cap);
      tcu::Surface::Surface((Surface *)&numFailed,iVar3,height);
      local_2f1 = 0;
      tcu::Surface::getAccess(&local_320,(Surface *)&numFailed);
      local_2f8 = compareGenMipmapBilinear
                            ((ConstPixelBufferAccess *)&errorMask.m_pixels.m_cap,
                             (ConstPixelBufferAccess *)&dst.m_data,&local_320,precision);
      if (local_2f8 == 0) {
        local_2f1 = 1;
      }
      else {
        tcu::TestLog::operator<<
                  ((MessageBuilder *)local_4a0,log,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_4a0,(char (*) [16])"WARNING: Level ");
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(int *)&face_1);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [8])0xf9a62c);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char **)&src.m_data);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (pMVar5,(char (*) [46])" comparison to bilinear method failed, found ");
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_2f8);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [17])0xf52aa4);
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_4a0);
      }
      if ((local_2f1 & 1) == 0) {
        tcu::Surface::getAccess(&local_4d0,(Surface *)&numFailed);
        local_4a4 = compareGenMipmapBox((ConstPixelBufferAccess *)&errorMask.m_pixels.m_cap,
                                        (ConstPixelBufferAccess *)&dst.m_data,&local_4d0,precision);
        if (local_4a4 == 0) {
          local_2f1 = 1;
        }
        else {
          tcu::TestLog::operator<<
                    ((MessageBuilder *)local_650,log,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar5 = tcu::MessageBuilder::operator<<
                             ((MessageBuilder *)local_650,(char (*) [16])"WARNING: Level ");
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(int *)&face_1);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [8])0xf9a62c);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char **)&src.m_data);
          pMVar5 = tcu::MessageBuilder::operator<<
                             (pMVar5,(char (*) [41])" comparison to box method failed, found ");
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_4a4);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [17])0xf52aa4);
          tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_650);
        }
      }
      if (((local_2f1 & 1) == 0) && (face == CUBEFACE_NEGATIVE_X)) {
        face = CUBEFACE_NEGATIVE_Y;
      }
      if ((local_2f1 & 1) == 0) {
        tcu::Surface::getAccess(&local_680,(Surface *)&numFailed);
        local_654 = compareGenMipmapVeryLenient
                              ((ConstPixelBufferAccess *)&errorMask.m_pixels.m_cap,
                               (ConstPixelBufferAccess *)&dst.m_data,&local_680,precision);
        if (local_654 == 0) {
          local_2f1 = 1;
        }
        else {
          tcu::TestLog::operator<<(&local_800,log,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar5 = tcu::MessageBuilder::operator<<(&local_800,(char (*) [14])"ERROR: Level ");
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(int *)&face_1);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [8])0xf9a62c);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char **)&src.m_data);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [21])" appears to contain ");
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_654);
          pMVar5 = tcu::MessageBuilder::operator<<
                             (pMVar5,(char (*) [40])" completely wrong pixels, failing case!");
          tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_800);
        }
      }
      if ((local_2f1 & 1) == 0) {
        face = CUBEFACE_POSITIVE_X;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c0,"Level",&local_8c1);
      de::toString<int>(&local_8e8,(int *)&face_1);
      std::operator+(&local_8a0,&local_8c0,&local_8e8);
      std::operator+(&local_880,&local_8a0,"Face");
      de::toString<int>(&local_908,(int *)&local_278);
      std::operator+(&local_860,&local_880,&local_908);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_9a8,"Level ",&local_9a9);
      de::toString<int>(&local_9d0,(int *)&face_1);
      std::operator+(&local_988,&local_9a8,&local_9d0);
      std::operator+(&local_968,&local_988,", face ");
      __s = src.m_data;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_9f0,(char *)__s,&local_9f1);
      std::operator+(&local_948,&local_968,&local_9f0);
      std::operator+(&local_928,&local_948," result");
      tcu::LogImageSet::LogImageSet(&local_840,&local_860,&local_928);
      this = tcu::TestLog::operator<<(log,&local_840);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_aa8,"Result",&local_aa9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_ad0,"Result",&local_ad1);
      tcu::LogImage::LogImage
                (&local_a88,&local_aa8,&local_ad0,
                 (ConstPixelBufferAccess *)&errorMask.m_pixels.m_cap,QP_IMAGE_COMPRESSION_MODE_BEST)
      ;
      tcu::TestLog::operator<<(this,&local_a88);
      tcu::LogImage::~LogImage(&local_a88);
      std::__cxx11::string::~string((string *)&local_ad0);
      std::allocator<char>::~allocator(&local_ad1);
      std::__cxx11::string::~string((string *)&local_aa8);
      std::allocator<char>::~allocator(&local_aa9);
      tcu::LogImageSet::~LogImageSet(&local_840);
      std::__cxx11::string::~string((string *)&local_928);
      std::__cxx11::string::~string((string *)&local_948);
      std::__cxx11::string::~string((string *)&local_9f0);
      std::allocator<char>::~allocator(&local_9f1);
      std::__cxx11::string::~string((string *)&local_968);
      std::__cxx11::string::~string((string *)&local_988);
      std::__cxx11::string::~string((string *)&local_9d0);
      std::__cxx11::string::~string((string *)&local_9a8);
      std::allocator<char>::~allocator(&local_9a9);
      std::__cxx11::string::~string((string *)&local_860);
      std::__cxx11::string::~string((string *)&local_908);
      std::__cxx11::string::~string((string *)&local_880);
      std::__cxx11::string::~string((string *)&local_8a0);
      std::__cxx11::string::~string((string *)&local_8e8);
      std::__cxx11::string::~string((string *)&local_8c0);
      std::allocator<char>::~allocator(&local_8c1);
      if ((local_2f1 & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b88,"ErrorMask",&local_b89);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_bb0,"Error mask",&local_bb1);
        tcu::LogImage::LogImage
                  (&local_b68,&local_b88,&local_bb0,(Surface *)&numFailed,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::TestLog::operator<<(log,&local_b68);
        tcu::LogImage::~LogImage(&local_b68);
        std::__cxx11::string::~string((string *)&local_bb0);
        std::allocator<char>::~allocator(&local_bb1);
        std::__cxx11::string::~string((string *)&local_b88);
        std::allocator<char>::~allocator(&local_b89);
      }
      tcu::TestLog::operator<<(log,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
      tcu::Surface::~Surface((Surface *)&numFailed);
    }
  }
  return face;
}

Assistant:

qpTestResult compareGenMipmapResult (tcu::TestLog& log, const tcu::TextureCube& resultTexture, const tcu::TextureCube& level0Reference, const GenMipmapPrecision& precision)
{
	qpTestResult result = QP_TEST_RESULT_PASS;

	static const char* s_faceNames[] = { "-X", "+X", "-Y", "+Y", "-Z", "+Z" };
	DE_STATIC_ASSERT(DE_LENGTH_OF_ARRAY(s_faceNames) == tcu::CUBEFACE_LAST);

	// Special comparison for level 0.
	for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
	{
		const tcu::CubeFace	face		= tcu::CubeFace(faceNdx);
		const tcu::Vec4		threshold	= select(precision.colorThreshold, tcu::Vec4(1.0f), precision.colorMask);
		const bool			level0Ok	= tcu::floatThresholdCompare(log,
																	 ("Level0Face" + de::toString(faceNdx)).c_str(),
																	 (string("Level 0, face ") + s_faceNames[face]).c_str(),
																	 level0Reference.getLevelFace(0, face),
																	 resultTexture.getLevelFace(0, face),
																	 threshold, tcu::COMPARE_LOG_RESULT);

		if (!level0Ok)
		{
			log << tcu::TestLog::Message << "ERROR: Level 0, face " << s_faceNames[face] << " comparison failed!" << tcu::TestLog::EndMessage;
			result = QP_TEST_RESULT_FAIL;
		}
	}

	for (int levelNdx = 1; levelNdx < resultTexture.getNumLevels(); levelNdx++)
	{
		for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
		{
			const tcu::CubeFace					face		= tcu::CubeFace(faceNdx);
			const char*							faceName	= s_faceNames[face];
			const tcu::ConstPixelBufferAccess	src			= resultTexture.getLevelFace(levelNdx-1,	face);
			const tcu::ConstPixelBufferAccess	dst			= resultTexture.getLevelFace(levelNdx,		face);
			tcu::Surface						errorMask	(dst.getWidth(), dst.getHeight());
			bool								levelOk		= false;

			// Try different comparisons in quality order.

			if (!levelOk)
			{
				const int numFailed = compareGenMipmapBilinear(dst, src, errorMask.getAccess(), precision);
				if (numFailed == 0)
					levelOk = true;
				else
					log << tcu::TestLog::Message << "WARNING: Level " << levelNdx << ", face " << faceName << " comparison to bilinear method failed, found " << numFailed << " invalid pixels." << tcu::TestLog::EndMessage;
			}

			if (!levelOk)
			{
				const int numFailed = compareGenMipmapBox(dst, src, errorMask.getAccess(), precision);
				if (numFailed == 0)
					levelOk = true;
				else
					log << tcu::TestLog::Message << "WARNING: Level " << levelNdx << ", face " << faceName <<" comparison to box method failed, found " << numFailed << " invalid pixels." << tcu::TestLog::EndMessage;
			}

			// At this point all high-quality methods have been used.
			if (!levelOk && result == QP_TEST_RESULT_PASS)
				result = QP_TEST_RESULT_QUALITY_WARNING;

			if (!levelOk)
			{
				const int numFailed = compareGenMipmapVeryLenient(dst, src, errorMask.getAccess(), precision);
				if (numFailed == 0)
					levelOk = true;
				else
					log << tcu::TestLog::Message << "ERROR: Level " << levelNdx << ", face " << faceName << " appears to contain " << numFailed << " completely wrong pixels, failing case!" << tcu::TestLog::EndMessage;
			}

			if (!levelOk)
				result = QP_TEST_RESULT_FAIL;

			log << tcu::TestLog::ImageSet(string("Level") + de::toString(levelNdx) + "Face" + de::toString(faceNdx), string("Level ") + de::toString(levelNdx) + ", face " + string(faceName) + " result")
				<< tcu::TestLog::Image("Result", "Result", dst);

			if (!levelOk)
				log << tcu::TestLog::Image("ErrorMask", "Error mask", errorMask);

			log << tcu::TestLog::EndImageSet;
		}
	}

	return result;
}